

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O3

void RigidBodyDynamics::ForwardDynamicsLagrangian
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,VectorNd *QDDot,
               LinearSolver linear_solver,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext,MatrixNd *H,
               VectorNd *C)

{
  uint uVar1;
  undefined1 auVar2 [16];
  DenseStorage<double,__1,__1,__1,_0> *pDVar3;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  undefined8 *puVar4;
  ulong rows;
  long lVar5;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  assign_op<double,_double> local_139;
  VectorNd *local_138;
  DenseStorage<double,__1,__1,__1,_0> *local_130;
  VectorNd *local_128;
  SrcXprType local_120;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_110;
  double *local_70;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_68;
  Index local_60;
  Index local_50;
  VectorNd *local_40;
  
  local_130 = (DenseStorage<double,__1,__1,__1,_0> *)H;
  local_128 = QDot;
  if (H == (MatrixNd *)0x0) {
    pDVar3 = (DenseStorage<double,__1,__1,__1,_0> *)operator_new(0x18);
    rows = CONCAT44(0,model->dof_count);
    pDVar3->m_data = (double *)0x0;
    pDVar3->m_rows = 0;
    pDVar3->m_cols = 0;
    local_130 = pDVar3;
    if (rows != 0) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = rows;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar2,0) < rows) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = operator_new;
        __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(pDVar3,rows * rows,rows,rows);
      lVar5 = pDVar3->m_cols * pDVar3->m_rows;
      if (0 < lVar5) {
        memset(pDVar3->m_data,0,lVar5 * 8);
      }
    }
  }
  this = &C->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  local_138 = Tau;
  if (C == (VectorNd *)0x0) {
    this = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)operator_new(0x10);
    uVar1 = model->dof_count;
    (this->m_storage).m_data = (double *)0x0;
    (this->m_storage).m_rows = 0;
    if ((ulong)uVar1 != 0) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(this,(ulong)uVar1,1);
      lVar5 = (this->m_storage).m_rows;
      if (0 < lVar5) {
        memset((this->m_storage).m_data,0,lVar5 << 3);
      }
    }
  }
  lVar5 = (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < lVar5) {
    memset((QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,
           0,lVar5 << 3);
  }
  InverseDynamics(model,Q,local_128,QDDot,(VectorNd *)this,f_ext);
  pDVar3 = local_130;
  CompositeRigidBodyAlgorithm(model,Q,(MatrixNd *)local_130,false);
  switch(linear_solver) {
  case LinearSolverPartialPivLU:
    Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_110,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pDVar3);
    local_60 = (this->m_storage).m_rows;
    local_120.m_rhs =
         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          *)&stack0xffffffffffffff90;
    local_50 = -0x4010000000000000;
    local_40 = local_138;
    local_120.m_dec = &local_110;
    local_68 = this;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(QDDot,(SrcXprType *)&local_120,&local_139);
    break;
  case LinearSolverColPivHouseholderQR:
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_110,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pDVar3);
    local_60 = (this->m_storage).m_rows;
    local_120.m_rhs =
         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          *)&stack0xffffffffffffff90;
    local_50 = -0x4010000000000000;
    local_40 = local_138;
    local_120.m_dec = &local_110;
    local_68 = this;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(QDDot,&local_120,&local_139);
    free(local_110.m_colNormsDirect.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
         m_storage.m_data);
    free(local_110.m_colNormsUpdated.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
         m_storage.m_data);
    free(local_110.m_temp.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
         m_data);
    free(local_110.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<long,_1,__1,_1,_1,__1>_>
         .m_storage.m_data);
    break;
  case LinearSolverHouseholderQR:
    Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_110,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pDVar3);
    local_60 = (this->m_storage).m_rows;
    local_120.m_rhs =
         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          *)&stack0xffffffffffffff90;
    local_50 = -0x4010000000000000;
    local_40 = local_138;
    local_120.m_dec = &local_110;
    local_68 = this;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(QDDot,(SrcXprType *)&local_120,&local_139);
    break;
  case LinearSolverLLT:
    Eigen::LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)&stack0xffffffffffffff90,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pDVar3);
    local_110.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = (this->m_storage).m_rows;
    local_120.m_rhs =
         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          *)&local_110;
    local_110.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = -0x4010000000000000;
    local_110.m_colsPermutation.m_indices.
    super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = (Index)local_138;
    local_120.m_dec =
         (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&stack0xffffffffffffff90;
    local_110.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         = (Index)this;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(QDDot,(SrcXprType *)&local_120,&local_139);
    goto LAB_00174b0f;
  default:
    goto switchD_0017488f_default;
  }
  free(local_110.m_colsPermutation.m_indices.
       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_110.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  local_70 = local_110.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
LAB_00174b0f:
  free(local_70);
switchD_0017488f_default:
  if (C == (VectorNd *)0x0) {
    free((this->m_storage).m_data);
    operator_delete(this,0x10);
  }
  if (H == (MatrixNd *)0x0) {
    free(pDVar3->m_data);
    operator_delete(pDVar3,0x18);
  }
  return;
}

Assistant:

RBDL_DLLAPI void ForwardDynamicsLagrangian (
    Model &model,
    const VectorNd &Q,
    const VectorNd &QDot,
    const VectorNd &Tau,
    VectorNd &QDDot,
    Math::LinearSolver linear_solver,
    std::vector<SpatialVector> *f_ext,
    Math::MatrixNd *H,
    Math::VectorNd *C) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  bool free_H = false;
  bool free_C = false;

  if (H == NULL) {
    H = new MatrixNd (MatrixNd::Zero(model.dof_count, model.dof_count));
    free_H = true;
  }

  if (C == NULL) {
    C = new VectorNd (VectorNd::Zero(model.dof_count));
    free_C = true;
  }

  // we set QDDot to zero to compute C properly with the InverseDynamics
  // method.
  QDDot.setZero();

  InverseDynamics (model, Q, QDot, QDDot, (*C), f_ext);
  CompositeRigidBodyAlgorithm (model, Q, *H, false);

  LOG << "A = " << std::endl << *H << std::endl;
  LOG << "b = " << std::endl << *C * -1. + Tau << std::endl;

#ifdef RBDL_USE_CASADI_MATH
    QDDot = H->inverse() * (*C * -1. + Tau);
#else
  switch (linear_solver) {
    case (LinearSolverPartialPivLU) :
      QDDot = H->partialPivLu().solve (*C * -1. + Tau);
      break;
    case (LinearSolverColPivHouseholderQR) :
      QDDot = H->colPivHouseholderQr().solve (*C * -1. + Tau);
      break;
    case (LinearSolverHouseholderQR) :
      QDDot = H->householderQr().solve (*C * -1. + Tau);
      break;
    case (LinearSolverLLT) :
      QDDot = H->llt().solve (*C * -1. + Tau);
      break;
    default:
      LOG << "Error: Invalid linear solver: " << linear_solver << std::endl;
      assert (0);
      break;
  }
#endif

  if (free_C) {
    delete C;
  }

  if (free_H) {
    delete H;
  }

  LOG << "x = " << QDDot << std::endl;
}